

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

Animation * rw::Animation::streamReadLegacy(Stream *stream)

{
  void *pvVar1;
  double dVar2;
  int32 iVar3;
  int32 flags;
  AnimInterpolatorInfo *interpInfo;
  Animation *pAVar4;
  long lVar5;
  void *data;
  float32 fVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  
  interpInfo = AnimInterpolatorInfo::find(1);
  iVar3 = Stream::readI32(stream);
  flags = Stream::readI32(stream);
  fVar6 = Stream::readF32(stream);
  pAVar4 = create(interpInfo,iVar3,flags,(float)fVar6);
  pvVar1 = pAVar4->keyframes;
  data = (void *)((long)pvVar1 + 0x1c);
  for (lVar5 = 0; lVar5 < pAVar4->numFrames; lVar5 = lVar5 + 1) {
    Stream::read32(stream,(void *)((long)data + -0x10),0x10);
    dVar2 = conj((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    *(double *)((long)data + -0x10) = dVar2;
    *(undefined8 *)((long)data + -8) = in_XMM1_Qa;
    Stream::read32(stream,data,0xc);
    fVar6 = Stream::readF32(stream);
    *(float32 *)((long)data + -0x14) = fVar6;
    iVar3 = Stream::readI32(stream);
    *(void **)((long)data + -0x1c) = (void *)((long)(iVar3 / 0x24) * 0x28 + (long)pvVar1);
    data = (void *)((long)data + 0x28);
  }
  return pAVar4;
}

Assistant:

Animation*
Animation::streamReadLegacy(Stream *stream)
{
	Animation *anim;
	AnimInterpolatorInfo *interpInfo = AnimInterpolatorInfo::find(1);
	int32 numFrames = stream->readI32();
	int32 flags = stream->readI32();
	float duration = stream->readF32();
	anim = Animation::create(interpInfo, numFrames, flags, duration);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		stream->read32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->read32(&frames[i].t, 3*4);
		frames[i].time = stream->readF32();
		int32 prev = stream->readI32()/0x24;
		frames[i].prev = &frames[prev];
	}
	return anim;
}